

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format_priv.h
# Opt level: O1

void _ST_PRIVATE::format_numeric_s<signed_char>
               (format_spec *format,format_writer *output,char value)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  out_of_range *this;
  undefined8 uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint_formatter<unsigned_char> formatter;
  ulong auStack_90 [2];
  code *pcStack_80;
  code *pcStack_78;
  format_spec fStack_6c;
  byte local_19 [9];
  byte *local_10;
  
  switch(format->digit_class) {
  case digit_default:
  case digit_dec:
    uVar9 = 10;
    break;
  case digit_hex:
    uVar9 = 0x10;
    break;
  case digit_hex_upper:
    uVar9 = 0x10;
    bVar4 = true;
    goto LAB_001f06f4;
  case digit_oct:
    uVar9 = 8;
    break;
  case digit_bin:
    uVar9 = 2;
    break;
  default:
    format_numeric_s<signed_char>();
    auStack_90[1] = 0;
    auStack_90[0] = (ulong)*(byte *)&output->_vptr_format_writer;
    pcStack_78 = std::
                 _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                 ::_M_invoke;
    pcStack_80 = std::
                 _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                 ::_M_manager;
    lVar10 = 0;
    while( true ) {
      bVar4 = ST::format_writer::next_format((format_writer *)format);
      if (!bVar4) {
        if (pcStack_80 != (code *)0x0) {
          (*pcStack_80)(auStack_90,auStack_90,3);
        }
        return;
      }
      ST::format_writer::parse_format(&fStack_6c,(format_writer *)format);
      iVar3 = fStack_6c.arg_index;
      lVar6 = (long)fStack_6c.arg_index + -1;
      if ((long)fStack_6c.arg_index < 0) {
        lVar6 = lVar10;
      }
      if (lVar6 != 0) break;
      if (pcStack_80 == (code *)0x0) {
        uVar7 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar7);
      }
      (*pcStack_78)(auStack_90,&fStack_6c,format);
      lVar10 = lVar10 + (ulong)((uint)iVar3 >> 0x1f);
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Parameter index out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  bVar4 = false;
LAB_001f06f4:
  local_19[1] = 0;
  if (value == '\0') {
    local_10 = local_19;
    local_19[0] = 0x30;
  }
  else {
    uVar5 = (uint)(byte)((value ^ value >> 7) - (value >> 7));
    local_10 = local_19 + 1;
    do {
      uVar2 = (ulong)uVar5 % uVar9;
      local_10 = local_10 + -1;
      bVar8 = (byte)uVar2;
      if ((uint)uVar2 < 10) {
        bVar8 = bVar8 | 0x30;
      }
      else if (bVar4) {
        bVar8 = bVar8 + 0x37;
      }
      else {
        bVar8 = bVar8 + 0x57;
      }
      *local_10 = bVar8;
      bVar1 = (uint)uVar9 <= uVar5;
      uVar5 = (uint)(uVar5 / uVar9);
    } while (bVar1);
  }
  bVar8 = 2;
  if (value != '\0') {
    bVar8 = (byte)value >> 7;
  }
  format_numeric_string
            (format,output,(char *)local_10,(long)(local_19 + 1) - (long)local_10,(uint)bVar8);
  return;
}

Assistant:

void format_numeric_s(const ST::format_spec &format,
                          ST::format_writer &output, int_T value)
    {
        static_assert(std::is_signed<int_T>::value,
                      "Use _format_numeric_u for unsigned numerics");

        int radix = 10;
        bool upper_case = false;
        switch (format.digit_class) {
        case ST::digit_hex_upper:
            upper_case = true;
            /* fall through */
        case ST::digit_hex:
            radix = 16;
            break;
        case ST::digit_oct:
            radix = 8;
            break;
        case ST::digit_bin:
            radix = 2;
            break;
        case ST::digit_dec:
        case ST::digit_default:
            break;
        default:
            ST_ASSERT(false, "Invalid digit class for _format_numeric_s");
        }

        typedef typename std::make_unsigned<int_T>::type uint_T;
        ST::uint_formatter<uint_T> formatter;
        formatter.format(static_cast<uint_T>(std::abs(value)), radix, upper_case);

        const numeric_type ntype = (value == 0) ? numeric_zero
                                 : (value < 0) ? numeric_negative
                                 : numeric_positive;

        format_numeric_string(format, output, formatter.text(), formatter.size(), ntype);
    }